

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestXmlElementHandler.cpp
# Opt level: O0

bool __thiscall
TestXmlElementHandler::paragraphMargin
          (TestXmlElementHandler *this,qreal *left,qreal *top,qreal *right,qreal *bottom,
          QDomElement *xmlElement)

{
  bool bVar1;
  undefined1 auVar2 [12];
  QString local_78;
  undefined4 local_5c;
  undefined8 local_58;
  QString local_50;
  QDomElement *local_38;
  QDomElement *xmlElement_local;
  qreal *bottom_local;
  qreal *right_local;
  qreal *top_local;
  qreal *left_local;
  TestXmlElementHandler *this_local;
  
  local_38 = xmlElement;
  xmlElement_local = (QDomElement *)bottom;
  bottom_local = right;
  right_local = top;
  top_local = left;
  left_local = (qreal *)this;
  QDomElement::tagName();
  bVar1 = QString::operator==(&local_50,"paragraph-margins");
  if (!bVar1) {
    auVar2 = qt_assert("xmlElement.tagName() == \"paragraph-margins\"",
                       "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/TestXmlElementHandler.cpp"
                       ,0xd8);
    local_5c = auVar2._8_4_;
    local_58 = auVar2._0_8_;
    QString::~QString(&local_50);
    _Unwind_Resume(local_58);
  }
  QString::~QString(&local_50);
  QString::QString(&local_78,"paragraph-margins");
  QList<QString>::operator<<(&this->cb,&local_78);
  QString::~QString(&local_78);
  return true;
}

Assistant:

bool TestXmlElementHandler::paragraphMargin(qreal &left, qreal &top, qreal &right, qreal &bottom, const QDomElement &xmlElement)
{
    Q_UNUSED(left);
    Q_UNUSED(top);
    Q_UNUSED(right);
    Q_UNUSED(bottom);
    Q_UNUSED(xmlElement); // unused in release mode
    Q_ASSERT(xmlElement.tagName() == "paragraph-margins");
    cb << "paragraph-margins";
    return true;
}